

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O0

bool __thiscall
SQVM::PLOCAL_INC(SQVM *this,SQInteger op,SQObjectPtr *target,SQObjectPtr *a,SQObjectPtr *incr)

{
  byte bVar1;
  SQObjectPtr *in_RSI;
  SQObjectPtr *in_RDI;
  SQUnsignedInteger unaff_retaddr;
  SQVM *in_stack_00000008;
  SQObjectPtr trg;
  SQObjectPtr *this_00;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 uVar2;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  SQObjectPtr local_40 [2];
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  this_00 = local_40;
  ::SQObjectPtr::SQObjectPtr(this_00);
  bVar1 = ARITH_OP(in_stack_00000008,unaff_retaddr,
                   (SQObjectPtr *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                   in_RDI,in_RSI);
  if ((bool)bVar1) {
    uVar2 = bVar1;
    ::SQObjectPtr::operator=
              ((SQObjectPtr *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
               (SQObjectPtr *)CONCAT17(bVar1,in_stack_ffffffffffffffa8));
    ::SQObjectPtr::operator=
              ((SQObjectPtr *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
               (SQObjectPtr *)CONCAT17(uVar2,in_stack_ffffffffffffffa8));
  }
  ::SQObjectPtr::~SQObjectPtr(this_00);
  return (bool)(bVar1 & 1);
}

Assistant:

bool SQVM::PLOCAL_INC(SQInteger op,SQObjectPtr &target, SQObjectPtr &a, SQObjectPtr &incr)
{
    SQObjectPtr trg;
    _RET_ON_FAIL(ARITH_OP( op , trg, a, incr));
    target = a;
    a = trg;
    return true;
}